

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.h
# Opt level: O3

void __thiscall raspicam::_private::Private_Impl::PORT_USERDATA::waitForFrame(PORT_USERDATA *this)

{
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = &this->_mutex;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  this->wantToGrab = true;
  ThreadCondition::Wait(&this->Thcond,&local_20);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void waitForFrame() {
                    //_mutex.lock();
                    std::unique_lock<std::mutex> lck ( _mutex );

                    wantToGrab=true;
//                    _mutex.unlock();
//                    Thcond.Wait();
                       Thcond.Wait(lck); //this will unlock the mutex and wait atomically
                }